

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::GetLocalObjectFiles
          (cmLocalUnixMakefileGenerator3 *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
          *localObjectFiles)

{
  cmMakefile *this_00;
  cmSourceFile *source;
  cmTarget *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  mapped_type *this_01;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  bool hasSourceExtension;
  string dir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  string objectName;
  cmGeneratorTargetsType targets;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  bool local_161;
  undefined1 local_160 [8];
  _Alloc_hider local_158;
  undefined1 local_150 [24];
  cmGeneratorTarget *local_138;
  string local_130;
  cmLocalUnixMakefileGenerator3 *local_110;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_108;
  string local_e8;
  string local_c8;
  _Rb_tree_node_base *local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110 = this;
  local_a0 = (_Base_ptr)localObjectFiles;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::_Rb_tree(&local_90,&(((this->super_cmLocalGenerator).Makefile)->GeneratorTargets)._M_t);
  if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_90._M_impl.super__Rb_tree_header) {
    p_Var5 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_138 = (cmGeneratorTarget *)p_Var5[1]._M_parent;
      iVar3 = cmGeneratorTarget::GetType(local_138);
      if (iVar3 != 7) {
        local_108.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_00 = (local_110->super_cmLocalGenerator).Makefile;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"CMAKE_BUILD_TYPE","");
        pcVar4 = cmMakefile::GetSafeDefinition(this_00,&local_130);
        std::__cxx11::string::string((string *)local_160,pcVar4,(allocator *)&local_e8);
        cmGeneratorTarget::GetObjectSources(local_138,&local_108,(string *)local_160);
        if (local_160 != (undefined1  [8])local_150) {
          operator_delete((void *)local_160,local_150._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                   local_130.field_2._M_local_buf[0]) + 1);
        }
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        local_130._M_string_length = 0;
        local_130.field_2._M_local_buf[0] = '\0';
        local_a8 = p_Var5;
        cmMakefile::GetCurrentBinaryDirectory(local_138->Makefile);
        std::__cxx11::string::append((char *)&local_130);
        std::__cxx11::string::append((char *)&local_130);
        (*(local_110->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
                  ((LocalObjectEntry *)local_160,local_110,local_138->Target);
        std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_160);
        if (local_160 != (undefined1  [8])local_150) {
          operator_delete((void *)local_160,local_150._0_8_ + 1);
        }
        std::__cxx11::string::append((char *)&local_130);
        for (p_Var6 = (_Base_ptr)
                      local_108.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            p_Var6 != (_Base_ptr)
                      local_108.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            p_Var6 = (_Base_ptr)&p_Var6->_M_parent) {
          source = *(cmSourceFile **)p_Var6;
          local_161 = true;
          cmLocalGenerator::GetObjectFileNameWithoutTarget
                    (&local_e8,&local_110->super_cmLocalGenerator,source,&local_130,&local_161);
          bVar2 = cmsys::SystemTools::FileIsFullPath(local_e8._M_dataplus._M_p);
          if (bVar2) {
            cmsys::SystemTools::GetFilenameName((string *)local_160,&local_e8);
            std::__cxx11::string::operator=((string *)&local_e8,(string *)local_160);
            if (local_160 != (undefined1  [8])local_150) {
              operator_delete((void *)local_160,local_150._0_8_ + 1);
            }
          }
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                                  *)local_a0,&local_e8);
          this_01->HasSourceExtension = local_161;
          pcVar1 = local_138->Target;
          local_98 = p_Var6;
          cmSourceFile::GetLanguage_abi_cxx11_(&local_c8,source);
          local_160 = (undefined1  [8])pcVar1;
          local_158._M_p = local_150 + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,local_c8._M_dataplus._M_p,
                     local_c8._M_dataplus._M_p + local_c8._M_string_length);
          std::
          vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
          ::emplace_back<cmLocalUnixMakefileGenerator3::LocalObjectEntry>
                    (&this_01->
                      super_vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
                     ,(LocalObjectEntry *)local_160);
          if (local_158._M_p != local_150 + 8) {
            operator_delete(local_158._M_p,local_150._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          p_Var6 = local_98;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                   local_130.field_2._M_local_buf[0]) + 1);
        }
        p_Var5 = local_a8;
        if ((_Base_ptr)
            local_108.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
          operator_delete(local_108.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_108.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_90._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::
GetLocalObjectFiles(std::map<std::string, LocalObjectInfo> &localObjectFiles)
{
  std::set<std::string> emitted;
  cmGeneratorTargetsType targets = this->Makefile->GetGeneratorTargets();
  for(cmGeneratorTargetsType::iterator ti = targets.begin();
      ti != targets.end(); ++ti)
    {
    cmGeneratorTarget* gt = ti->second;
    if (gt->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    std::vector<cmSourceFile const*> objectSources;
    gt->GetObjectSources(objectSources, this->Makefile
                                    ->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    // Compute full path to object file directory for this target.
    std::string dir;
    dir += gt->Makefile->GetCurrentBinaryDirectory();
    dir += "/";
    dir += this->GetTargetDirectory(*gt->Target);
    dir += "/";
    // Compute the name of each object file.
    for(std::vector<cmSourceFile const*>::iterator
          si = objectSources.begin();
        si != objectSources.end(); ++si)
      {
      cmSourceFile const* sf = *si;
      bool hasSourceExtension = true;
      std::string objectName = this->GetObjectFileNameWithoutTarget(*sf,
                                                                    dir,
                                                        &hasSourceExtension);
      if(cmSystemTools::FileIsFullPath(objectName.c_str()))
        {
        objectName = cmSystemTools::GetFilenameName(objectName);
        }
      LocalObjectInfo& info = localObjectFiles[objectName];
      info.HasSourceExtension = hasSourceExtension;
      info.push_back(LocalObjectEntry(gt->Target, sf->GetLanguage()));
      }
    }
}